

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-canvas.c
# Opt level: O0

void plutovg_canvas_restore(plutovg_canvas_t *canvas)

{
  plutovg_state_t *state;
  plutovg_state_t *old_state;
  plutovg_canvas_t *canvas_local;
  
  if (canvas->state->next != (plutovg_state *)0x0) {
    state = canvas->state;
    canvas->state = state->next;
    plutovg_state_reset(state);
    state->next = canvas->freed_state;
    canvas->freed_state = state;
  }
  return;
}

Assistant:

void plutovg_canvas_restore(plutovg_canvas_t* canvas)
{
    if(canvas->state->next == NULL)
        return;
    plutovg_state_t* old_state = canvas->state;
    canvas->state = old_state->next;
    plutovg_state_reset(old_state);
    old_state->next = canvas->freed_state;
    canvas->freed_state = old_state;
}